

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O0

int WebPPictureAlloc(WebPPicture *picture)

{
  int iVar1;
  int *in_RDI;
  WebPPicture *in_stack_00000038;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI == (int *)0x0) {
    iVar1 = 1;
  }
  else {
    WebPPictureFree((WebPPicture *)0x155c4b);
    if (*in_RDI == 0) {
      iVar1 = WebPPictureAllocYUVA(in_stack_00000038);
    }
    else {
      iVar1 = WebPPictureAllocARGB
                        ((WebPPicture *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
  }
  return iVar1;
}

Assistant:

int WebPPictureAlloc(WebPPicture* picture) {
  if (picture != NULL) {
    WebPPictureFree(picture);   // erase previous buffer

    if (!picture->use_argb) {
      return WebPPictureAllocYUVA(picture);
    } else {
      return WebPPictureAllocARGB(picture);
    }
  }
  return 1;
}